

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_TestPackAndUnpack_Test::TestBody
          (AnyTest_TestPackAndUnpack_Test *this)

{
  bool bVar1;
  Any *pAVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_230;
  Message local_228;
  int32_t local_220;
  int local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_158;
  Message local_150;
  string_view local_148;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  string data;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  TestAny message;
  undefined1 local_58 [8];
  TestAny submessage;
  AnyTest_TestPackAndUnpack_Test *this_local;
  
  submessage.field_0._48_8_ = this;
  proto2_unittest::TestAny::TestAny((TestAny *)local_58);
  proto2_unittest::TestAny::set_int32_value((TestAny *)local_58,0x3039);
  proto2_unittest::TestAny::TestAny((TestAny *)&gtest_ar_.message_);
  pAVar2 = proto2_unittest::TestAny::mutable_any_value((TestAny *)&gtest_ar_.message_);
  local_c1 = Any::PackFrom(pAVar2,(Message *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_c0,
               (AssertionResult *)"message.mutable_any_value()->PackFrom(submessage)","false","true"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  if (bVar1) {
    protobuf::MessageLite::SerializeAsString_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(MessageLite *)&gtest_ar_.message_);
    local_148 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&gtest_ar__1.message_);
    local_131 = protobuf::MessageLite::ParseFromString((MessageLite *)&gtest_ar_.message_,local_148)
    ;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_130,&local_131,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_130,(AssertionResult *)0x1d60fdb,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
                 ,0x24,pcVar3);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_150);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    if (bVar1) {
      local_189 = proto2_unittest::TestAny::has_any_value((TestAny *)&gtest_ar_.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_188,&local_189,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar1) {
        testing::Message::Message(&local_198);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_188,
                   (AssertionResult *)"message.has_any_value()","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
                   ,0x25,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_198);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      proto2_unittest::TestAny::Clear((TestAny *)local_58);
      pAVar2 = proto2_unittest::TestAny::any_value((TestAny *)&gtest_ar_.message_);
      local_1d1 = Any::UnpackTo(pAVar2,(Message *)local_58);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_1d0,
                   (AssertionResult *)"message.any_value().UnpackTo(&submessage)","false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
                   ,0x27,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
        testing::internal::AssertHelper::~AssertHelper(&local_1e8);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_1e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      if (bVar1) {
        local_21c = 0x3039;
        local_220 = proto2_unittest::TestAny::int32_value((TestAny *)local_58);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_218,"12345","submessage.int32_value()",&local_21c,&local_220);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
        if (!bVar1) {
          testing::Message::Message(&local_228);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
          testing::internal::AssertHelper::AssertHelper
                    (&local_230,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
                     ,0x28,pcVar3);
          testing::internal::AssertHelper::operator=(&local_230,&local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_230);
          testing::Message::~Message(&local_228);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
      }
    }
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
  }
  proto2_unittest::TestAny::~TestAny((TestAny *)&gtest_ar_.message_);
  proto2_unittest::TestAny::~TestAny((TestAny *)local_58);
  return;
}

Assistant:

TEST(AnyTest, TestPackAndUnpack) {
  proto2_unittest::TestAny submessage;
  submessage.set_int32_value(12345);
  proto2_unittest::TestAny message;
  ASSERT_TRUE(message.mutable_any_value()->PackFrom(submessage));

  std::string data = message.SerializeAsString();

  ASSERT_TRUE(message.ParseFromString(data));
  EXPECT_TRUE(message.has_any_value());
  submessage.Clear();
  ASSERT_TRUE(message.any_value().UnpackTo(&submessage));
  EXPECT_EQ(12345, submessage.int32_value());
}